

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocator.h
# Opt level: O2

SimpleHashedEntry<unsigned_int,_unsigned_int> * __thiscall
Memory::
AllocateArray<Memory::NoCheckHeapAllocator,JsUtil::SimpleHashedEntry<unsigned_int,unsigned_int>,false>
          (Memory *this,NoCheckHeapAllocator *allocator,
          offset_in_NoCheckHeapAllocator_to_subr AllocFunc,size_t count)

{
  SimpleHashedEntry<unsigned_int,_unsigned_int> *pSVar1;
  long *plVar2;
  
  plVar2 = (long *)((long)&(this->name)._M_dataplus._M_p + AllocFunc);
  if (((ulong)allocator & 1) != 0) {
    allocator = *(NoCheckHeapAllocator **)(allocator + *plVar2 + -1);
  }
  pSVar1 = (SimpleHashedEntry<unsigned_int,_unsigned_int> *)
           (*(code *)allocator)(plVar2,-(ulong)(count >> 0x3d != 0) | count << 3,-(count >> 0x3d));
  return pSVar1;
}

Assistant:

inline T * AllocateArray(TAllocator * allocator, char * (TAllocator::*AllocFunc)(size_t), DECLSPEC_GUARD_OVERFLOW size_t count)
{
    if (count == 0 && TAllocator::FakeZeroLengthArray)
    {
#ifdef TRACK_ALLOC
        allocator->ClearTrackAllocInfo();
#endif
        // C++ standard requires allocator to return non-null if it isn't out of memory
        // Just return some small number so we will still AV if someone try to use the memory
        return (T *)ZERO_LENGTH_ARRAY;
    }
    if (nothrow)
    {
        return new (allocator, nothrow, AllocFunc) T[count];
    }
    return new (allocator, AllocFunc) T[count];
}